

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputFile.cpp
# Opt level: O2

void __thiscall OutputFile::OutputFile(OutputFile *this,string *name_arg,string *version_arg)

{
  allocator<char> local_2a;
  allocator<char> local_29;
  
  (this->descendants).super__List_base<OutputFile_*,_std::allocator<OutputFile_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this;
  (this->descendants).super__List_base<OutputFile_*,_std::allocator<OutputFile_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this;
  (this->descendants).super__List_base<OutputFile_*,_std::allocator<OutputFile_*>_>._M_impl._M_node.
  _M_size = 0;
  std::__cxx11::string::string((string *)&this->name,(string *)name_arg);
  std::__cxx11::string::string((string *)&this->version,(string *)version_arg);
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  (this->key)._M_string_length = 0;
  (this->key).field_2._M_local_buf[0] = '\0';
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->eol,"\n",&local_29);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->keySeparator,"::",&local_2a);
  return;
}

Assistant:

OutputFile::OutputFile(const string & name_arg, const string & version_arg)
  : name(name_arg), version(version_arg), eol("\n"), keySeparator("::") {}